

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

void __thiscall
wasm::StructUtils::
StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>::
noteExpressionOrCopy
          (StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
           *this,Expression *expr,HeapType type,Index index,PossibleConstantValues *info)

{
  PassRunner *pPVar1;
  Module *module;
  uintptr_t uVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Expression **ppEVar5;
  HeapType HVar6;
  Expression *local_58;
  PossibleConstantValues *local_50;
  StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner> *local_48;
  uintptr_t local_40;
  Id local_34;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           ).super_Pass.runner;
  module = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           ).
           super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
           .
           super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
           .currModule;
  pEVar3 = expr;
  local_50 = info;
  local_48 = this;
  local_40 = type.id;
  local_34 = index;
  do {
    pEVar4 = pEVar3;
    local_58 = pEVar4;
    ppEVar5 = Properties::getImmediateFallthroughPtr(&local_58,&pPVar1->options,module,AllowTeeBrIf)
    ;
    pEVar3 = *ppEVar5;
  } while (*ppEVar5 != pEVar4);
  if ((pEVar4->type).id == (expr->type).id) {
    expr = pEVar4;
  }
  if ((((expr->_id == StructGetId) && (expr[1]._id == local_34)) &&
      (uVar2 = expr[1].type.id, *(long *)(uVar2 + 8) != 1)) &&
     (HVar6 = wasm::Type::getHeapType((Type *)(uVar2 + 8)), HVar6.id == local_40)) {
    return;
  }
  PossibleConstantValues::note
            (local_50,expr,
             (local_48->
             super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
             ).
             super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
             .
             super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
             .currModule);
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }